

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O3

ostream * __thiscall dg::debug::LLVMDG2Dot::printKey(LLVMDG2Dot *this,ostream *os,Value *val)

{
  Value VVar1;
  undefined2 *puVar2;
  raw_ostream *prVar3;
  raw_ostream *prVar4;
  ulong uVar5;
  char *pcVar6;
  StringRef SVar7;
  raw_os_ostream ro;
  string str;
  ostringstream ostr;
  code *local_200;
  undefined4 local_1f8;
  undefined4 *local_1f0;
  long lStack_1e8;
  undefined4 *local_1e0;
  undefined1 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  ostringstream *local_1c0;
  long *local_1b8;
  ulong local_1b0;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (val == (Value *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(null)",6);
    return os;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1f8 = 0;
  local_1d8 = 0;
  local_1d0 = 0;
  local_1c8 = 1;
  local_1f0 = (undefined4 *)0x0;
  lStack_1e8 = 0;
  local_1e0 = (undefined4 *)0x0;
  local_200 = std::__cxx11::stringbuf::str;
  VVar1 = val[0x10];
  local_1c0 = local_198;
  if (VVar1 == (Value)0x15) {
    SVar7 = (StringRef)llvm::Value::getName();
    prVar4 = (raw_ostream *)&local_200;
    prVar3 = llvm::raw_ostream::operator<<(prVar4,SVar7);
    puVar2 = *(undefined2 **)(prVar3 + 0x20);
    if ((ulong)(*(long *)(prVar3 + 0x18) - (long)puVar2) < 3) {
      llvm::raw_ostream::write((char *)prVar3,0x12c153);
    }
    else {
      *(undefined1 *)(puVar2 + 1) = 10;
      *puVar2 = 0x3a3a;
      *(long *)(prVar3 + 0x20) = *(long *)(prVar3 + 0x20) + 3;
    }
    if ((ulong)(lStack_1e8 - (long)local_1e0) < 6) {
      pcVar6 = "label ";
      goto LAB_00127b0a;
    }
    *(undefined2 *)(local_1e0 + 1) = 0x206c;
    *local_1e0 = 0x6562616c;
    local_1e0 = (undefined4 *)((long)local_1e0 + 6);
  }
  else {
    if (VVar1 != (Value)0x0) {
      if (0x1a < (byte)VVar1) {
        if (*(long *)(val + 0x28) == 0) {
          pcVar6 = "<null>::\n";
          prVar4 = (raw_ostream *)&local_200;
        }
        else {
          SVar7 = (StringRef)llvm::Value::getName();
          prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&local_200,SVar7);
          puVar2 = *(undefined2 **)(prVar4 + 0x20);
          if (2 < (ulong)(*(long *)(prVar4 + 0x18) - (long)puVar2)) {
            *(undefined1 *)(puVar2 + 1) = 10;
            *puVar2 = 0x3a3a;
            *(long *)(prVar4 + 0x20) = *(long *)(prVar4 + 0x20) + 3;
            goto LAB_00127b61;
          }
          pcVar6 = "::\n";
        }
        llvm::raw_ostream::write((char *)prVar4,(ulong)pcVar6);
      }
LAB_00127b61:
      llvm::Value::print((raw_ostream *)val,false);
      goto LAB_00127b70;
    }
    pcVar6 = "FUNC ";
LAB_00127b0a:
    prVar4 = (raw_ostream *)llvm::raw_ostream::write((char *)&local_200,(ulong)pcVar6);
  }
  SVar7 = (StringRef)llvm::Value::getName();
  llvm::raw_ostream::operator<<(prVar4,SVar7);
LAB_00127b70:
  if (local_1e0 != local_1f0) {
    llvm::raw_ostream::flush_nonempty();
  }
  std::__cxx11::stringbuf::str();
  if (100 < local_1b0) {
    std::__cxx11::string::resize((ulong)&local_1b8,'(');
  }
  uVar5 = std::__cxx11::string::find((char)&local_1b8,0x22);
  if (uVar5 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)&local_1b8,uVar5,(char *)0x1,0x12c157);
      uVar5 = std::__cxx11::string::find((char)&local_1b8,0x22);
    } while (uVar5 != 0xffffffffffffffff);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1b8,local_1b0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_200);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return os;
}

Assistant:

std::ostream &printKey(std::ostream &os, llvm::Value *val) override {
        return printLLVMVal(os, val);
    }